

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O0

void __thiscall lsim::Simulator::clear_nodes(Simulator *this)

{
  Simulator *this_local;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->m_free_nodes);
  std::vector<lsim::Value,_std::allocator<lsim::Value>_>::clear(&this->m_node_values_read);
  std::vector<lsim::Value,_std::allocator<lsim::Value>_>::clear(&this->m_node_values_write);
  std::vector<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>::clear
            (&this->m_node_metadata);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->m_dirty_nodes_read);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->m_dirty_nodes_write);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->m_node_write_time);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->m_node_change_time);
  return;
}

Assistant:

void Simulator::clear_nodes() {
    m_free_nodes.clear();
    m_node_values_read.clear();
    m_node_values_write.clear();
    m_node_metadata.clear();
    m_dirty_nodes_read.clear();
    m_dirty_nodes_write.clear();
    m_node_write_time.clear();
    m_node_change_time.clear();
}